

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

bool __thiscall BrokerClient::start(BrokerClient *this)

{
  int iVar1;
  char *in_stack_00000078;
  MlmWrap *in_stack_00000080;
  MlmWrap *in_stack_000001b8;
  undefined1 local_1;
  
  iVar1 = MlmWrap::initialize(in_stack_000001b8);
  if (iVar1 == 0) {
    iVar1 = MlmWrap::setProducer(in_stack_00000080,in_stack_00000078);
    if (iVar1 == 0) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool BrokerClient::start(){
    if(initialize()){
        //Could not initialize! 
        return false;
    }
    if(setProducer(TRODES_NETWORK_ID)){
        return false;
    }
    return true;
}